

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O1

int __thiscall glcts::MRTCaseGroup::init(MRTCaseGroup *this,EVP_PKEY_CTX *ctx)

{
  GLSLVersion GVar1;
  Context *pCVar2;
  int extraout_EAX;
  TestNode *pTVar3;
  
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"MRT_array","GL_KHR_blend_equation_advanced");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215b750;
  *(GLSLVersion *)&pTVar3[1].m_testCtx = GVar1;
  *(undefined4 *)((long)&pTVar3[1].m_testCtx + 4) = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"MRT_separate","GL_KHR_blend_equation_advanced");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215b750;
  *(GLSLVersion *)&pTVar3[1].m_testCtx = GVar1;
  *(undefined4 *)((long)&pTVar3[1].m_testCtx + 4) = 1;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  return extraout_EAX;
}

Assistant:

void init(void)
	{
		addChild(new MRTCase(m_context, m_glslVersion, MRTCase::ARRAY));
		addChild(new MRTCase(m_context, m_glslVersion, MRTCase::SEPARATE));
	}